

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::AttachmentInteractionCase::iterate
          (AttachmentInteractionCase *this)

{
  ostringstream *this_00;
  int log [2];
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint framebuffer;
  GLuint renderbuffer;
  GLuint local_1b8;
  undefined4 local_1b4;
  IVec2 local_1b0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar3;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  log = (int  [2])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_1b8 = 0;
  local_1b4 = 0;
  (**(code **)(lVar3 + 0x6d0))(1,&local_1b8);
  (**(code **)(lVar3 + 0x78))(0x8ca9,local_1b8);
  (**(code **)(lVar3 + 0x678))(0x8ca9,0x9310,(this->m_defaultSpec).width);
  (**(code **)(lVar3 + 0x678))(0x8ca9,0x9311,(this->m_defaultSpec).height);
  (**(code **)(lVar3 + 0x678))(0x8ca9,0x9313,(this->m_defaultSpec).samples);
  (**(code **)(lVar3 + 0x6e8))(1,&local_1b4);
  (**(code **)(lVar3 + 0xa0))(0x8d41,local_1b4);
  (**(code **)(lVar3 + 0x1240))
            (0x8d41,(this->m_attachmentSpec).samples,0x8058,(this->m_attachmentSpec).width,
             (this->m_attachmentSpec).height);
  (**(code **)(lVar3 + 0x688))(0x8d40,0x8ce0,0x8d41,local_1b4);
  this_00 = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Verifying ",10);
  std::ostream::operator<<(this_00,(this->m_attachmentSpec).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,(this->m_attachmentSpec).height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," framebuffer with ",0x12);
  std::ostream::operator<<(this_00,(this->m_attachmentSpec).samples);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x multisampling",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," and defaults set to ",0x15);
  std::ostream::operator<<(this_00,(this->m_defaultSpec).width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
  std::ostream::operator<<(this_00,(this->m_defaultSpec).height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," with ",6);
  std::ostream::operator<<(this_00,(this->m_defaultSpec).samples);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x multisampling",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  local_1a8._0_4_ = (this->m_attachmentSpec).width;
  local_1a8._4_4_ = (this->m_attachmentSpec).height;
  bVar1 = checkFramebufferRenderable((TestLog *)log,this->m_renderCtx,local_1b8,(IVec2 *)local_1a8);
  if (bVar1) {
    local_1b0.m_data[0] = (this->m_attachmentSpec).width;
    local_1b0.m_data[1] = (this->m_attachmentSpec).height;
    bVar1 = checkFramebufferSize((TestLog *)log,this->m_renderCtx,local_1b8,&local_1b0);
    if (bVar1) {
      this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_015e0487;
    }
  }
  this_01 = (this->super_TestCase).super_TestNode.m_testCtx;
  description = "Framebuffer did not behave as expected";
  testResult = QP_TEST_RESULT_FAIL;
LAB_015e0487:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  (**(code **)(lVar3 + 0x460))(1,&local_1b4);
  (**(code **)(lVar3 + 0x440))(1,&local_1b8);
  return STOP;
}

Assistant:

AttachmentInteractionCase::IterateResult AttachmentInteractionCase::iterate (void)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	TestLog&				log			= m_testCtx.getLog();
	GLuint					framebuffer	= 0;
	GLuint					renderbuffer= 0;

	gl.genFramebuffers(1, &framebuffer);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, m_defaultSpec.width);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, m_defaultSpec.height);
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_SAMPLES, m_defaultSpec.samples);

	gl.genRenderbuffers(1, &renderbuffer);
	gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_attachmentSpec.samples, GL_RGBA8, m_attachmentSpec.width, m_attachmentSpec.height);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, renderbuffer);

	log << TestLog::Message << "Verifying " << m_attachmentSpec.width << "x" << m_attachmentSpec.height << " framebuffer with " << m_attachmentSpec.samples << "x multisampling"
		<< " and defaults set to " << m_defaultSpec.width << "x" << m_defaultSpec.height << " with " << m_defaultSpec.samples << "x multisampling" << TestLog::EndMessage;

	if(checkFramebufferRenderable(log, m_renderCtx, framebuffer, IVec2(m_attachmentSpec.width, m_attachmentSpec.height))
	   && checkFramebufferSize(log, m_renderCtx, framebuffer, IVec2(m_attachmentSpec.width, m_attachmentSpec.height)))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Framebuffer did not behave as expected");

	gl.deleteRenderbuffers(1, &renderbuffer);
	gl.deleteFramebuffers(1, &framebuffer);

	return STOP;
}